

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

bool __thiscall CLI::Option::operator==(Option *this,Option *other)

{
  pointer pbVar1;
  bool bVar2;
  string *sname;
  pointer pbVar3;
  bool bVar4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar3 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar3 == pbVar1) {
      pbVar3 = (this->lnames_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->lnames_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pbVar3 == pbVar1) {
          pbVar3 = (other->snames_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (other->snames_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pbVar3 == pbVar1) {
              pbVar3 = (other->lnames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pbVar1 = (other->lnames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              do {
                bVar4 = pbVar3 == pbVar1;
                bVar2 = !bVar4;
                if (bVar4) {
                  return bVar2;
                }
                ::std::__cxx11::string::string((string *)&local_b0,(string *)pbVar3);
                bVar4 = check_lname(this,&local_b0);
                ::std::__cxx11::string::~string((string *)&local_b0);
                pbVar3 = pbVar3 + 1;
              } while (!bVar4);
              return bVar2;
            }
            ::std::__cxx11::string::string((string *)&local_90,(string *)pbVar3);
            bVar2 = check_sname(this,&local_90);
            ::std::__cxx11::string::~string((string *)&local_90);
            pbVar3 = pbVar3 + 1;
          } while (!bVar2);
          return true;
        }
        ::std::__cxx11::string::string((string *)&local_70,(string *)pbVar3);
        bVar2 = check_lname(other,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        pbVar3 = pbVar3 + 1;
      } while (!bVar2);
      return true;
    }
    ::std::__cxx11::string::string((string *)&local_50,(string *)pbVar3);
    bVar2 = check_sname(other,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    pbVar3 = pbVar3 + 1;
  } while (!bVar2);
  return true;
}

Assistant:

bool operator==(const Option &other) const {
        for(const std::string &sname : snames_)
            if(other.check_sname(sname))
                return true;
        for(const std::string &lname : lnames_)
            if(other.check_lname(lname))
                return true;
        // We need to do the inverse, just in case we are ignore_case
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return true;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return true;
        return false;
    }